

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_q4_1_ref(float *x,block_q4_1 *y,int64_t k)

{
  ggml_fp16_t gVar1;
  int j_1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  int j;
  long lVar5;
  byte bVar6;
  uint8_t *puVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float f;
  
  uVar8 = 0;
  uVar2 = k / 0x20 & 0xffffffff;
  if ((int)(k / 0x20) < 1) {
    uVar2 = uVar8;
  }
  puVar7 = y->qs;
  for (; uVar8 != uVar2; uVar8 = uVar8 + 1) {
    uVar3 = (ulong)((uint)uVar8 & 0x7ffffff);
    fVar9 = -3.4028235e+38;
    f = 3.4028235e+38;
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
      fVar11 = x[uVar3 * 0x20 + lVar5];
      fVar10 = fVar11;
      if (f <= fVar11) {
        fVar10 = f;
      }
      if (fVar11 <= fVar9) {
        fVar11 = fVar9;
      }
      fVar9 = fVar11;
      f = fVar10;
    }
    fVar9 = (fVar9 - f) / 15.0;
    fVar11 = (float)(-(uint)(fVar9 != 0.0) & (uint)(1.0 / fVar9));
    gVar1 = ggml_compute_fp32_to_fp16(fVar9);
    y[uVar8].field_0.field_0.d = gVar1;
    gVar1 = ggml_compute_fp32_to_fp16(f);
    y[uVar8].field_0.field_0.m = gVar1;
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      bVar4 = (byte)(int)((x[uVar3 * 0x20 + lVar5] - f) * fVar11 + 0.5);
      if ('\x0e' < (char)bVar4) {
        bVar4 = 0xf;
      }
      bVar6 = (byte)(int)((x[uVar3 * 0x20 + lVar5 + 0x10] - f) * fVar11 + 0.5);
      if ('\x0e' < (char)bVar6) {
        bVar6 = 0xf;
      }
      puVar7[lVar5] = bVar6 << 4 | bVar4;
    }
    puVar7 = puVar7 + 0x14;
  }
  return;
}

Assistant:

void quantize_row_q4_1_ref(const float * GGML_RESTRICT x, block_q4_1 * GGML_RESTRICT y, int64_t k) {
    const int qk = QK4_1;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        float min = FLT_MAX;
        float max = -FLT_MAX;

        for (int j = 0; j < qk; j++) {
            const float v = x[i*qk + j];

            if (v < min) min = v;
            if (v > max) max = v;
        }

        const float d  = (max - min) / ((1 << 4) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);
        y[i].m = GGML_FP32_TO_FP16(min);

        for (int j = 0; j < qk/2; ++j) {
            const float x0 = (x[i*qk + 0    + j] - min)*id;
            const float x1 = (x[i*qk + qk/2 + j] - min)*id;

            const uint8_t xi0 = MIN(15, (int8_t)(x0 + 0.5f));
            const uint8_t xi1 = MIN(15, (int8_t)(x1 + 0.5f));

            y[i].qs[j]  = xi0;
            y[i].qs[j] |= xi1 << 4;
        }
    }
}